

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O3

void __thiscall QWizard::setCurrentId(QWizard *this,int id)

{
  QWizardPrivate *this_00;
  char cVar1;
  bool bVar2;
  ulong uVar3;
  long in_FS_OFFSET;
  char local_48 [24];
  char *local_30;
  uint local_24;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWizardPrivate **)&(this->super_QDialog).super_QWidget.field_0x8;
  local_24 = id;
  if (this_00->current != id && this_00->current != -1) {
    uVar3 = (ulong)(uint)id;
    cVar1 = (**(code **)(*(long *)&(this->super_QDialog).super_QWidget + 0x1c8))();
    if (cVar1 != '\0') {
      if (-1 < id) {
        bVar2 = QMap<int,_QWizardPage_*>::contains(&this_00->pageMap,(int *)&local_24);
        uVar3 = (ulong)local_24;
        if (bVar2) {
          QWizardPrivate::switchToPage
                    (this_00,local_24,
                     (uint)(*(int *)(*(long *)&(this->super_QDialog).super_QWidget.field_0x8 + 0x340
                                    ) <= (int)local_24));
          goto LAB_0050e70e;
        }
      }
      local_48[0] = '\x02';
      local_48[1] = '\0';
      local_48[2] = '\0';
      local_48[3] = '\0';
      local_48[4] = '\0';
      local_48[5] = '\0';
      local_48[6] = '\0';
      local_48[7] = '\0';
      local_48[8] = '\0';
      local_48[9] = '\0';
      local_48[10] = '\0';
      local_48[0xb] = '\0';
      local_48[0xc] = '\0';
      local_48[0xd] = '\0';
      local_48[0xe] = '\0';
      local_48[0xf] = '\0';
      local_48[0x10] = '\0';
      local_48[0x11] = '\0';
      local_48[0x12] = '\0';
      local_48[0x13] = '\0';
      local_48[0x14] = '\0';
      local_48[0x15] = '\0';
      local_48[0x16] = '\0';
      local_48[0x17] = '\0';
      local_30 = "default";
      QMessageLogger::warning(local_48,"QWizard::setCurrentId: No such page: %d",uVar3);
    }
  }
LAB_0050e70e:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWizard::setCurrentId(int id)
{
    Q_D(QWizard);

    if (d->current == -1)
        return;

    if (currentId() == id)
        return;

    if (!validateCurrentPage())
        return;

    if (id < 0 || Q_UNLIKELY(!d->pageMap.contains(id))) {
        qWarning("QWizard::setCurrentId: No such page: %d", id);
        return;
    }

    d->switchToPage(id, (id < currentId()) ? QWizardPrivate::Backward : QWizardPrivate::Forward);
}